

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindAllExtensionNumbers
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          string *containing_type,vector<int,_std::allocator<int>_> *output)

{
  const_iterator this_00;
  bool bVar1;
  pointer ppVar2;
  __type local_a1;
  iterator local_80;
  _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>
  local_78;
  byte local_6d;
  bool success;
  int local_5c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>
  local_28;
  const_iterator it;
  vector<int,_std::allocator<int>_> *output_local;
  string *containing_type_local;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this_local;
  
  local_5c = 0;
  it._M_node = (_Base_ptr)output;
  std::make_pair<std::__cxx11::string_const&,int>(&local_58,containing_type,&local_5c);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>_>
       ::lower_bound(&this->by_extension_,&local_58);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_58);
  local_6d = 0;
  while( true ) {
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>_>
         ::end(&this->by_extension_);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>
    ::_Rb_tree_const_iterator(&local_78,&local_80);
    bVar1 = std::operator!=(&local_28,&local_78);
    local_a1 = false;
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>
               ::operator->(&local_28);
      local_a1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)ppVar2,containing_type);
    }
    this_00._M_node = it._M_node;
    if (local_a1 == false) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>
             ::operator->(&local_28);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_00._M_node,&(ppVar2->first).second);
    local_6d = 1;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>
    ::operator++(&local_28);
  }
  return (bool)(local_6d & 1);
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::FindAllExtensionNumbers(
    const string& containing_type,
    std::vector<int>* output) {
  typename std::map<std::pair<string, int>, Value>::const_iterator it =
      by_extension_.lower_bound(std::make_pair(containing_type, 0));
  bool success = false;

  for (; it != by_extension_.end() && it->first.first == containing_type;
       ++it) {
    output->push_back(it->first.second);
    success = true;
  }

  return success;
}